

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

iterator __thiscall
cs::tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
          (tree_type<cs::token_base*> *this,iterator it,token_base **args)

{
  tree_node *ptVar1;
  iterator iVar2;
  error *this_00;
  allocator local_41;
  string local_40;
  
  ptVar1 = *(tree_node **)this;
  if (ptVar1 == it.mData) {
    iVar2.mData = (tree_node *)operator_new(0x20);
    (iVar2.mData)->root = (tree_node *)0x0;
    (iVar2.mData)->left = ptVar1;
    (iVar2.mData)->right = (tree_node *)0x0;
    (iVar2.mData)->data = *args;
    *(tree_node **)this = iVar2.mData;
  }
  else {
    if (it.mData == (tree_node *)0x0) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"E000E",&local_41);
      cov::error::error(this_00,&local_40);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    iVar2.mData = (tree_node *)operator_new(0x20);
    ptVar1 = (it.mData)->root;
    (iVar2.mData)->root = ptVar1;
    (iVar2.mData)->left = it.mData;
    (iVar2.mData)->right = (tree_node *)0x0;
    (iVar2.mData)->data = *args;
    (&ptVar1->left)[ptVar1->left != it.mData] = iVar2.mData;
    (it.mData)->root = iVar2.mData;
  }
  return (iterator)iVar2.mData;
}

Assistant:

iterator emplace_root_left(iterator it, Args &&...args)
		{
			if (it.mData == mRoot) {
				mRoot = new tree_node(nullptr, mRoot, nullptr, std::forward<Args>(args)...);
				return mRoot;
			}
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *node = new tree_node(it.mData->root, it.mData, nullptr, std::forward<Args>(args)...);
			if (it.mData->root->left == it.mData)
				it.mData->root->left = node;
			else
				it.mData->root->right = node;
			it.mData->root = node;
			return node;
		}